

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

ostream * despot::operator<<(ostream *os,vector<int,_std::allocator<int>_> *vec)

{
  ostream *this;
  char *pcVar1;
  int i;
  ulong uVar2;
  
  std::operator<<(os,"[");
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    pcVar1 = ", ";
    if (uVar2 == 0) {
      pcVar1 = "";
    }
    this = std::operator<<(os,pcVar1);
    std::ostream::operator<<
              (this,(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar2]);
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}